

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

string * __thiscall
mocker::nasm::fmtDirective_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Directive> *directive)

{
  _Alloc_hider _Var1;
  shared_ptr<mocker::nasm::Default> p;
  shared_ptr<mocker::nasm::Extern> p_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  dyc<mocker::nasm::Default,std::shared_ptr<mocker::nasm::Directive>const&>
            ((nasm *)&local_48,(shared_ptr<mocker::nasm::Directive> *)this);
  _Var1._M_p = local_48._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::operator+(__return_storage_ptr__,"default ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_48._M_dataplus._M_p + 8));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    dyc<mocker::nasm::Global,std::shared_ptr<mocker::nasm::Directive>const&>
              ((nasm *)&local_48,(shared_ptr<mocker::nasm::Directive> *)this);
    _Var1._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::operator+(__return_storage_ptr__,"global ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_48._M_dataplus._M_p + 8));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      dyc<mocker::nasm::Extern,std::shared_ptr<mocker::nasm::Directive>const&>
                ((nasm *)&local_28,(shared_ptr<mocker::nasm::Directive> *)this);
      if (local_28 != 0) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_48,*(long *)(local_28 + 8),
                   *(long *)(local_28 + 0x10) + *(long *)(local_28 + 8));
        std::operator+(__return_storage_ptr__,"extern ",&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      }
      if (local_28 == 0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                      ,0x17,
                      "std::string mocker::nasm::fmtDirective(const std::shared_ptr<Directive> &)");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtDirective(const std::shared_ptr<Directive> &directive) {
  if (auto p = dyc<Default>(directive))
    return "default " + p->getMode();
  if (auto p = dyc<Global>(directive))
    return "global " + p->getIdentifier();
  if (auto p = dyc<Extern>(directive)) {
#ifdef ONLINE_JUDGE_SUPPORT
    return "";
#endif
    return "extern " + p->getIdentifier();
  }
  assert(false);
}